

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_lat.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *__s;
  uint64_t uVar7;
  size_t __size;
  uint uVar8;
  undefined1 auVar9 [16];
  nn_stopwatch sw;
  int opt;
  nn_stopwatch nStack_58;
  undefined4 local_4c;
  double local_48;
  double dStack_40;
  
  if (argc == 4) {
    pcVar1 = argv[1];
    uVar2 = atoi(argv[2]);
    uVar3 = atoi(argv[3]);
    iVar4 = nn_socket(1,0x10);
    if (iVar4 == -1) {
      __assert_fail("s != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x3b,"int main(int, char **)");
    }
    local_4c = 1;
    iVar5 = nn_setsockopt(iVar4,0xfffffffd,1,&local_4c,4);
    if (iVar5 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x3e,"int main(int, char **)");
    }
    iVar5 = nn_connect(iVar4,pcVar1);
    if (iVar5 < 0) {
      __assert_fail("rc >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x40,"int main(int, char **)");
    }
    __size = (size_t)(int)uVar2;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      __assert_fail("buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x43,"int main(int, char **)");
    }
    memset(__s,0x6f,__size);
    nn_stopwatch_init(&nStack_58);
    for (uVar8 = uVar3; uVar8 != 0; uVar8 = uVar8 - 1) {
      uVar6 = nn_send(iVar4,__s,__size,0);
      if (uVar6 != uVar2) {
        __assert_fail("nbytes == (int)sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                      ,0x49,"int main(int, char **)");
      }
      uVar6 = nn_recv(iVar4,__s,__size);
      if (uVar6 != uVar2) {
        __assert_fail("nbytes == (int)sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                      ,0x4b,"int main(int, char **)");
      }
    }
    uVar7 = nn_stopwatch_term(&nStack_58);
    auVar9._8_4_ = (int)(uVar7 >> 0x20);
    auVar9._0_8_ = uVar7;
    auVar9._12_4_ = 0x45300000;
    dStack_40 = auVar9._8_8_ - 1.9342813113834067e+25;
    local_48 = (dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) /
               (double)(int)(uVar3 * 2);
    iVar5 = 0;
    printf("message size: %d [B]\n",(ulong)uVar2);
    printf("roundtrip count: %d\n",(ulong)uVar3);
    printf("average latency: %.3f [us]\n");
    free(__s);
    iVar4 = nn_close(iVar4);
    if (iVar4 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/perf/remote_lat.c"
                    ,0x57,"int main(int, char **)");
    }
  }
  else {
    puts("usage: remote_lat <connect-to> <msg-size> <roundtrips>");
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int main (int argc, char *argv [])
{
    const char *connect_to;
    size_t sz;
    int rts;
    char *buf;
    int nbytes;
    int s;
    int rc;
    int i;
    int opt;
    struct nn_stopwatch sw;
    uint64_t total;
    double lat;


    if (argc != 4) {
        printf ("usage: remote_lat <connect-to> <msg-size> <roundtrips>\n");
        return 1;
    }
    connect_to = argv [1];
    sz = atoi (argv [2]);
    rts = atoi (argv [3]);

    s = nn_socket (AF_SP, NN_PAIR);
    assert (s != -1);
    opt = 1;
    rc = nn_setsockopt (s, NN_TCP, NN_TCP_NODELAY, &opt, sizeof (opt));
    assert (rc == 0);
    rc = nn_connect (s, connect_to);
    assert (rc >= 0);

    buf = malloc (sz);
    assert (buf);
    memset (buf, 111, sz);

    nn_stopwatch_init (&sw);
    for (i = 0; i != rts; i++) {
        nbytes = nn_send (s, buf, sz, 0);
        assert (nbytes == (int)sz);
        nbytes = nn_recv (s, buf, sz, 0);
        assert (nbytes == (int)sz);
    }
    total = nn_stopwatch_term (&sw);

    lat = (double) total / (rts * 2);
    printf ("message size: %d [B]\n", (int) sz);
    printf ("roundtrip count: %d\n", (int) rts);
    printf ("average latency: %.3f [us]\n", (double) lat);

    free (buf);

    rc = nn_close (s);
    assert (rc == 0);

    return 0;
}